

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O3

void __thiscall mp::QP2Passes::Process(QP2Passes *this,Expr expr)

{
  unsigned_long_long uVar1;
  size_ty sVar2;
  ExprBase EVar3;
  double dVar4;
  
  EVar3.impl_ = (Impl *)0x0;
  if (*(int *)expr.super_ExprBase.impl_ - 0x2aU < 4) {
    EVar3.impl_ = (Impl *)expr.super_ExprBase.impl_;
  }
  (this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ =
       EVar3.impl_;
  RunPass1(this);
  if ((this->n_qp_terms_ != 0) &&
     (uVar1 = this->visitor_->n_source_terms_qp_,
     sVar2 = (this->visitor_->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size,
     dVar4 = ((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0),
     dVar4 * 0.25 * dVar4 <
     ((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) {
    RunPass2Full(this);
    return;
  }
  RunPass2Buckets(this);
  return;
}

Assistant:

void QP2Passes::Process(Expr expr) {
  assert(expr::Kind::SUM == expr.kind());             //for now
  top_expr_ = Cast<internal::ExprTypes::SumExpr>(expr);
  RunPass1();
  if (Pass2SeemsWorth())
    RunPass2Full();
  else
    RunPass2Buckets();
}